

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void warning(char *stptr)

{
  int local_18;
  int local_14;
  int temp;
  int i;
  char *stptr_local;
  
  local_14 = 4;
  for (local_18 = slnum; local_18 != 0; local_18 = local_18 / 10) {
    prlnbuf[local_14] = (char)(local_18 % 10) + '0';
    local_14 = local_14 + -1;
  }
  if (infile_error != infile_num) {
    infile_error = infile_num;
    printf("#[%i]   %s\n",(ulong)(uint)infile_num,(long)infile_num * 0x88 + 0x123d70);
  }
  loadlc(loccnt,0);
  printf("%s\n",prlnbuf);
  printf("       %s\n",stptr);
  return;
}

Assistant:

void
warning(char *stptr)
{
	int i, temp;

	/* put the source line number into prlnbuf */
	i = 4;
	temp = slnum;
	while (temp != 0) {
		prlnbuf[i--] = temp % 10 + '0';
		temp /= 10;
	}

	/* update the current file name */
	if (infile_error != infile_num) {
		infile_error  = infile_num;
		printf("#[%i]   %s\n", infile_num, input_file[infile_num].name);
	}

	/* output the line and the error message */
	loadlc(loccnt, 0);
	printf("%s\n", prlnbuf);
	printf("       %s\n", stptr);
}